

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

Vec_Wec_t * Vec_WecAlloc(int nCap)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *local_20;
  Vec_Wec_t *p;
  int nCap_local;
  
  pVVar1 = (Vec_Wec_t *)malloc(0x10);
  p._4_4_ = nCap;
  if ((0 < nCap) && (nCap < 8)) {
    p._4_4_ = 8;
  }
  pVVar1->nSize = 0;
  pVVar1->nCap = p._4_4_;
  if (pVVar1->nCap == 0) {
    local_20 = (Vec_Int_t *)0x0;
  }
  else {
    local_20 = (Vec_Int_t *)calloc((long)pVVar1->nCap,0x10);
  }
  pVVar1->pArray = local_20;
  return pVVar1;
}

Assistant:

static inline Vec_Wec_t * Vec_WecAlloc( int nCap )
{
    Vec_Wec_t * p;
    p = ABC_ALLOC( Vec_Wec_t, 1 );
    if ( nCap > 0 && nCap < 8 )
        nCap = 8;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_CALLOC( Vec_Int_t, p->nCap ) : NULL;
    return p;
}